

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-types.cpp
# Opt level: O1

vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *
wasm::HeapTypeGenerator::getInhabitable
          (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__return_storage_ptr__,
          vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *types)

{
  pointer pHVar1;
  iterator __position;
  bool bVar2;
  pointer pHVar3;
  undefined1 local_a8 [8];
  unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
  visited;
  unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
  visiting;
  HeapType type;
  
  local_a8 = (undefined1  [8])&visited._M_h._M_rehash_policy._M_next_resize;
  visited._M_h._M_buckets = (__buckets_ptr)0x1;
  visited._M_h._M_bucket_count = 0;
  visited._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visited._M_h._M_element_count._0_4_ = 0x3f800000;
  visited._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  visited._M_h._M_rehash_policy._4_4_ = 0;
  visited._M_h._M_rehash_policy._M_next_resize = 0;
  visited._M_h._M_single_bucket = (__node_base_ptr)&visiting._M_h._M_rehash_policy._M_next_resize;
  visiting._M_h._M_buckets = (__buckets_ptr)0x1;
  visiting._M_h._M_bucket_count = 0;
  visiting._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visiting._M_h._M_element_count._0_4_ = 0x3f800000;
  visiting._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  visiting._M_h._M_rehash_policy._4_4_ = 0;
  visiting._M_h._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pHVar3 = (types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pHVar1 = (types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pHVar3 != pHVar1) {
    do {
      visiting._M_h._M_single_bucket = (__node_base_ptr)pHVar3->id;
      bVar2 = anon_unknown_24::isUninhabitable
                        ((HeapType)visiting._M_h._M_single_bucket,
                         (unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                          *)local_a8,
                         (unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                          *)&visited._M_h._M_single_bucket);
      if (!bVar2) {
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
          _M_realloc_insert<wasm::HeapType_const&>
                    ((vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)__return_storage_ptr__
                     ,__position,(HeapType *)&visiting._M_h._M_single_bucket);
        }
        else {
          (__position._M_current)->id = (uintptr_t)visiting._M_h._M_single_bucket;
          (__return_storage_ptr__->
          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
      pHVar3 = pHVar3 + 1;
    } while (pHVar3 != pHVar1);
  }
  std::
  _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&visited._M_h._M_single_bucket);
  std::
  _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_a8);
  return __return_storage_ptr__;
}

Assistant:

std::vector<HeapType>
HeapTypeGenerator::getInhabitable(const std::vector<HeapType>& types) {
  std::unordered_set<HeapType> visited, visiting;
  std::vector<HeapType> inhabitable;
  for (auto type : types) {
    if (!isUninhabitable(type, visited, visiting)) {
      inhabitable.push_back(type);
    }
  }
  return inhabitable;
}